

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O3

void __thiscall Assimp::glTF2Exporter::ExportAnimations(glTF2Exporter *this)

{
  char *__s;
  size_type *psVar1;
  vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *pvVar2;
  aiAnimation *paVar3;
  aiNodeAnim *nodeChannel;
  char *pcVar4;
  aiScene *paVar5;
  undefined8 *puVar6;
  vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *pvVar7;
  ulong uVar8;
  float ticksPerSecond;
  Ref<glTF2::Animation> RVar9;
  Ref<glTF2::Node> RVar10;
  string name;
  Sampler rotationSampler;
  Sampler scaleSampler;
  string nameAnim;
  Sampler translationSampler;
  string local_278;
  undefined1 local_258 [24];
  uint local_240;
  Interpolation local_238;
  undefined1 local_230 [24];
  uint local_218;
  Interpolation local_210;
  long *local_208;
  char *local_200;
  long local_1f8 [2];
  aiAnimation *local_1e8;
  Ref<glTF2::Node> local_1e0;
  Ref<glTF2::Animation> local_1d0;
  Ref<glTF2::Buffer> local_1c0;
  ulong local_1b0;
  undefined1 local_1a8 [24];
  uint local_190;
  Interpolation local_188;
  ios_base local_138 [264];
  
  local_1c0.vector =
       &(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        buffers).mObjs;
  local_1c0.index = 0;
  paVar5 = this->mScene;
  if (paVar5->mNumAnimations != 0) {
    local_1b0 = 0;
    do {
      paVar3 = paVar5->mAnimations[local_1b0];
      ticksPerSecond = (float)paVar3->mTicksPerSecond;
      local_208 = local_1f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"anim","");
      pcVar4 = local_200;
      local_1e8 = paVar3;
      if ((paVar3->mName).length != 0) {
        __s = (paVar3->mName).data;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_208,0,pcVar4,(ulong)__s);
      }
      if (local_1e8->mNumChannels != 0) {
        uVar8 = 0;
        do {
          nodeChannel = local_1e8->mChannels[uVar8];
          local_258._0_8_ = local_258 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_258,local_208,local_200 + (long)local_208);
          std::__cxx11::string::append((char *)local_258);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          pvVar7 = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0xf;
          if ((vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)local_258._0_8_ !=
              (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)(local_258 + 0x10)) {
            pvVar7 = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
                     local_258._16_8_;
          }
          pvVar2 = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
                   (CONCAT44(local_230._12_4_,local_230._8_4_) +
                   CONCAT44(local_258._12_4_,local_258._8_4_));
          if (pvVar7 < pvVar2) {
            pvVar7 = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0xf;
            if ((vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)local_230._0_8_ !=
                (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)(local_230 + 0x10))
            {
              pvVar7 = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
                       local_230._16_8_;
            }
            if (pvVar7 < pvVar2) goto LAB_0038b24a;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)local_230,0,(char *)0x0,local_258._0_8_);
          }
          else {
LAB_0038b24a:
            puVar6 = (undefined8 *)std::__cxx11::string::_M_append(local_258,local_230._0_8_);
          }
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          psVar1 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_278.field_2._M_allocated_capacity = *psVar1;
            local_278.field_2._8_8_ = puVar6[3];
          }
          else {
            local_278.field_2._M_allocated_capacity = *psVar1;
            local_278._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_278._M_string_length = puVar6[1];
          *puVar6 = psVar1;
          puVar6[1] = 0;
          *(undefined1 *)psVar1 = 0;
          if ((vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)local_230._0_8_ !=
              (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)(local_230 + 0x10)) {
            operator_delete((void *)local_230._0_8_,
                            (ulong)((long)&(((_Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                              *)local_230._16_8_)->_M_impl).super__Vector_impl_data.
                                           _M_start + 1));
          }
          if ((vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)local_258._0_8_ !=
              (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)(local_258 + 0x10)) {
            operator_delete((void *)local_258._0_8_,
                            (ulong)((long)&(((_Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                              *)local_258._16_8_)->_M_impl).super__Vector_impl_data.
                                           _M_start + 1));
          }
          glTF2::Asset::FindUniqueID
                    ((string *)local_1a8,
                     (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&local_278,"animation");
          std::__cxx11::string::operator=((string *)&local_278,(string *)local_1a8);
          if ((vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)local_1a8._0_8_ !=
              (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_,
                            (ulong)((long)&(((_Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                              *)local_1a8._16_8_)->_M_impl).super__Vector_impl_data.
                                           _M_start + 1));
          }
          RVar9 = glTF2::LazyDict<glTF2::Animation>::Create
                            (&((this->mAsset).
                               super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->animations,local_278._M_dataplus._M_p);
          local_1d0.vector = RVar9.vector;
          local_1d0.index = RVar9.index;
          RVar10 = glTF2::LazyDict<glTF2::Node>::Get
                             (&((this->mAsset).
                                super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->nodes,(nodeChannel->mNodeName).data);
          local_1e0.vector = RVar10.vector;
          local_1e0.index = RVar10.index;
          local_1a8._0_8_ = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0;
          local_1a8._8_4_ = 0;
          local_1a8._16_8_ = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0;
          local_190 = 0;
          local_188 = Interpolation_LINEAR;
          ExtractTranslationSampler
                    ((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&local_278,&local_1c0,nodeChannel,ticksPerSecond,(Sampler *)local_1a8);
          AddSampler(&local_1d0,&local_1e0,(Sampler *)local_1a8,AnimationPath_TRANSLATION);
          local_258._0_8_ = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0;
          local_258._8_4_ = 0;
          local_258._16_8_ = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0;
          local_240 = 0;
          local_238 = Interpolation_LINEAR;
          ExtractRotationSampler
                    ((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&local_278,&local_1c0,nodeChannel,ticksPerSecond,(Sampler *)local_258);
          AddSampler(&local_1d0,&local_1e0,(Sampler *)local_258,AnimationPath_ROTATION);
          local_230._0_8_ = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0;
          local_230._8_4_ = 0;
          local_230._16_8_ = (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0;
          local_218 = 0;
          local_210 = Interpolation_LINEAR;
          ExtractScaleSampler((this->mAsset).
                              super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              &local_278,&local_1c0,nodeChannel,ticksPerSecond,(Sampler *)local_230)
          ;
          AddSampler(&local_1d0,&local_1e0,(Sampler *)local_230,AnimationPath_SCALE);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < local_1e8->mNumChannels);
      }
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      local_1b0 = local_1b0 + 1;
      paVar5 = this->mScene;
    } while (local_1b0 < paVar5->mNumAnimations);
  }
  return;
}

Assistant:

void glTF2Exporter::ExportAnimations()
{
    Ref<Buffer> bufferRef = mAsset->buffers.Get(unsigned (0));

    for (unsigned int i = 0; i < mScene->mNumAnimations; ++i) {
        const aiAnimation* anim = mScene->mAnimations[i];
        const float ticksPerSecond = static_cast<float>(anim->mTicksPerSecond);

        std::string nameAnim = "anim";
        if (anim->mName.length > 0) {
            nameAnim = anim->mName.C_Str();
        }

        for (unsigned int channelIndex = 0; channelIndex < anim->mNumChannels; ++channelIndex) {
            const aiNodeAnim* nodeChannel = anim->mChannels[channelIndex];

            // It appears that assimp stores this type of animation as multiple animations.
            // where each aiNodeAnim in mChannels animates a specific node.
            std::string name = nameAnim + "_" + to_string(channelIndex);
            name = mAsset->FindUniqueID(name, "animation");
            Ref<Animation> animRef = mAsset->animations.Create(name);

            Ref<Node> animNode = mAsset->nodes.Get(nodeChannel->mNodeName.C_Str());

            Animation::Sampler translationSampler;
            ExtractTranslationSampler(*mAsset, name, bufferRef, nodeChannel, ticksPerSecond, translationSampler);
            AddSampler(animRef, animNode, translationSampler, AnimationPath_TRANSLATION);

            Animation::Sampler rotationSampler;
            ExtractRotationSampler(*mAsset, name, bufferRef, nodeChannel, ticksPerSecond, rotationSampler);
            AddSampler(animRef, animNode, rotationSampler, AnimationPath_ROTATION);

            Animation::Sampler scaleSampler;
            ExtractScaleSampler(*mAsset, name, bufferRef, nodeChannel, ticksPerSecond, scaleSampler);
            AddSampler(animRef, animNode, scaleSampler, AnimationPath_SCALE);
        }

        // Assimp documentation staes this is not used (not implemented)
        // for (unsigned int channelIndex = 0; channelIndex < anim->mNumMeshChannels; ++channelIndex) {
        //     const aiMeshAnim* meshChannel = anim->mMeshChannels[channelIndex];
        // }

    } // End: for-loop mNumAnimations
}